

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

LIBSSH2_CHANNEL * libssh2_channel_forward_accept(LIBSSH2_LISTENER *listener)

{
  int iVar1;
  time_t start_time;
  void *pvVar2;
  LIBSSH2_CHANNEL *entry;
  char *errmsg;
  
  if (listener == (LIBSSH2_LISTENER *)0x0) {
    entry = (LIBSSH2_CHANNEL *)0x0;
  }
  else {
    start_time = time((time_t *)0x0);
    while( true ) {
      do {
        iVar1 = _libssh2_transport_read(listener->session);
      } while (0 < iVar1);
      pvVar2 = _libssh2_list_first(&listener->queue);
      if (pvVar2 != (void *)0x0) break;
      if (iVar1 == -0x25) {
        iVar1 = -0x25;
        errmsg = "Would block waiting for packet";
      }
      else {
        iVar1 = -0x17;
        errmsg = "Channel not found";
      }
      _libssh2_error(listener->session,iVar1,errmsg);
      if (listener->session->api_block_mode == 0) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
      iVar1 = libssh2_session_last_errno(listener->session);
      if (iVar1 != -0x25) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
      iVar1 = _libssh2_wait_socket(listener->session,start_time);
      if (iVar1 != 0) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
    }
    entry = (LIBSSH2_CHANNEL *)_libssh2_list_first(&listener->queue);
    _libssh2_list_remove((list_node *)entry);
    listener->queue_size = listener->queue_size + -1;
    _libssh2_list_add(&entry->session->channels,(list_node *)entry);
  }
  return entry;
}

Assistant:

static LIBSSH2_CHANNEL *
channel_forward_accept(LIBSSH2_LISTENER *listener)
{
    int rc;

    do {
        rc = _libssh2_transport_read(listener->session);
    } while(rc > 0);

    if(_libssh2_list_first(&listener->queue)) {
        LIBSSH2_CHANNEL *channel = _libssh2_list_first(&listener->queue);

        /* detach channel from listener's queue */
        _libssh2_list_remove(&channel->node);

        listener->queue_size--;

        /* add channel to session's channel list */
        _libssh2_list_add(&channel->session->channels, &channel->node);

        return channel;
    }

    if(rc == LIBSSH2_ERROR_EAGAIN) {
        _libssh2_error(listener->session, LIBSSH2_ERROR_EAGAIN,
                       "Would block waiting for packet");
    }
    else
        _libssh2_error(listener->session, LIBSSH2_ERROR_CHANNEL_UNKNOWN,
                       "Channel not found");
    return NULL;
}